

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__filename;
  ulong uVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  XMVFrameSpec *pXVar5;
  XMVFrameSpec frame;
  int i;
  LPStatus status;
  FILE *xmv_fp;
  char *path;
  XMV *xmv;
  int ch;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  iVar2 = LPGetopt(argc,argv,"h");
  if (iVar2 == -1) {
    if (argc - _optind < 1) {
      usage();
      argv_local._4_4_ = 1;
    }
    else {
      path = (char *)0x0;
      __filename = argv[_optind];
      __stream = fopen(__filename,"rb");
      if (__stream == (FILE *)0x0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        LPWarn("xmv","couldn\'t open %s: %s",__filename,pcVar4);
      }
      else {
        path = (char *)XMV_NewFromFile((FILE *)__stream,(LPStatus *)&frame.e);
        if (frame._12_4_ == 0) {
          fclose(__stream);
          LPLog("xmv","%s: This is XMV type %d",__filename,(ulong)((XMV *)path)->type);
          LPLog("xmv","%d total frames",(ulong)((XMV *)path)->n_frames);
          frame.c = 0;
          frame.d = 0;
          for (; (uint)frame._8_4_ < ((XMV *)path)->n_frames; frame._8_4_ = frame._8_4_ + 1) {
            pXVar5 = ((XMV *)path)->frames + (int)frame._8_4_;
            uVar1._0_2_ = pXVar5->marker;
            uVar1._2_2_ = pXVar5->xpkentry;
            uVar1._4_2_ = pXVar5->a;
            uVar1._6_2_ = pXVar5->b;
            frame.marker = pXVar5->c;
            frame.xpkentry = pXVar5->d;
            frame.a = pXVar5->e;
            frame.b = pXVar5->f;
            printf("frame=%02d\t%d\t%d,%d,%d,%d,%d,%d\n",(ulong)(uint)frame._8_4_,uVar1 & 0xffff,
                   uVar1 >> 0x20 & 0xffff,uVar1 >> 0x30,frame._0_8_ & 0xffff,
                   (uint)(ushort)frame.xpkentry,(uint)(ushort)frame.a,(uint)(ushort)frame.b);
          }
          XMV_Free((XMV *)path);
          return 0;
        }
        pcVar4 = LPStatusString(frame._12_4_);
        LPWarn("xmv","couldn\'t read %s: %s",__filename,pcVar4);
      }
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      XMV_Free((XMV *)path);
      argv_local._4_4_ = 1;
    }
  }
  else if ((iVar2 == 0x3f) || (iVar2 != 0x68)) {
    usage();
    argv_local._4_4_ = 1;
  }
  else {
    usage();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
#ifdef LUNAPURPURA_HAVE_GETPROGNAME
	progname = (char *)getprogname();
#else
	progname = argv[0];
#endif

	int ch;

	while ((ch = LPGetopt(argc, argv, "h")) != -1) {
		switch (ch) {
		case 'h':
			usage();
			return EXIT_SUCCESS;
			break;
		case '?': /* FALLTHROUGH */
		default:
			usage();
			return EXIT_FAILURE;
		}
	}
	argc -= optind;
	argv += optind;

	if (argc < 1) {
		usage();
		return EXIT_FAILURE;
	}

	XMV *xmv = NULL;

	const char *path = argv[0];
	FILE *xmv_fp = fopen(path, "rb");

	if (!xmv_fp) {
		LPWarn(LP_SUBSYSTEM_XMV, "couldn't open %s: %s", path, strerror(errno));
		goto fail;
	}

	LPStatus status;
	xmv = XMV_NewFromFile(xmv_fp, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(LP_SUBSYSTEM_XMV, "couldn't read %s: %s", path, LPStatusString(status));
		goto fail;
	}

	fclose(xmv_fp);

	LPLog(LP_SUBSYSTEM_XMV, "%s: This is XMV type %d", path, xmv->type);
	LPLog(LP_SUBSYSTEM_XMV, "%d total frames", xmv->n_frames);

	for (int i = 0; i < xmv->n_frames; i++) {
		XMVFrameSpec frame = xmv->frames[i];
		printf(
			"frame=%02d\t%d\t%d,%d,%d,%d,%d,%d\n",
			i,
			frame.marker,
			frame.a, frame.b, frame.c, frame.d, frame.e, frame.f
		);
	}

	XMV_Free(xmv);
	return EXIT_SUCCESS;

fail:
	if (xmv_fp) fclose(xmv_fp);
	XMV_Free(xmv);
	return EXIT_FAILURE;
}